

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

bool __thiscall pobr::imgProcessing::structs::Segment::isLetterC(Segment *this)

{
  double dVar1;
  uint8_t local_81 [9];
  double hu7;
  double local_70;
  double hu6;
  double local_60;
  double hu5;
  double local_50;
  double hu4;
  double local_40;
  double hu3;
  double local_30;
  double hu2;
  double local_20;
  double hu1;
  Segment *this_local;
  
  hu2._7_1_ = 1;
  hu1 = (double)this;
  local_20 = getHuMomentInvariant(this,(uint8_t *)((long)&hu2 + 7));
  hu3._7_1_ = 2;
  local_30 = getHuMomentInvariant(this,(uint8_t *)((long)&hu3 + 7));
  hu4._7_1_ = 3;
  local_40 = getHuMomentInvariant(this,(uint8_t *)((long)&hu4 + 7));
  hu5._7_1_ = 4;
  local_50 = getHuMomentInvariant(this,(uint8_t *)((long)&hu5 + 7));
  hu6._7_1_ = 5;
  local_60 = getHuMomentInvariant(this,(uint8_t *)((long)&hu6 + 7));
  hu7._7_1_ = 6;
  local_70 = getHuMomentInvariant(this,(uint8_t *)((long)&hu7 + 7));
  local_81[0] = '\a';
  dVar1 = getHuMomentInvariant(this,local_81);
  if ((local_20 < 0.32875319999999997) || (0.6503290500000001 < local_20)) {
    this_local._7_1_ = false;
  }
  else if ((local_30 < 0.00033915) || (0.13758150000000002 < local_30)) {
    this_local._7_1_ = false;
  }
  else if ((local_40 < 0.005281999999999999) || (0.07366065 < local_40)) {
    this_local._7_1_ = false;
  }
  else if ((local_50 < 5.32e-05) || (0.01238475 < local_50)) {
    this_local._7_1_ = false;
  }
  else if ((local_60 < -0.0001953) || (2.625e-05 < local_60)) {
    this_local._7_1_ = false;
  }
  else if ((local_70 < -0.0022953) || (-7.695e-05 < local_70)) {
    this_local._7_1_ = false;
  }
  else if ((dVar1 < 0.02773335) || (0.06630225000000001 < dVar1)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

const bool
Segment::isLetterC()
const
{
    const auto hu1 = this->getHuMomentInvariant(1);
    const auto hu2 = this->getHuMomentInvariant(2);
    const auto hu3 = this->getHuMomentInvariant(3);
    const auto hu4 = this->getHuMomentInvariant(4);
    const auto hu5 = this->getHuMomentInvariant(5);
    const auto hu6 = this->getHuMomentInvariant(6);
    const auto hu7 = this->getHuMomentInvariant(7);

    if (hu1 < 0.346056 * 0.95 || hu1 > 0.619361 * 1.05) {
        return false;
    }
    if (hu2 < 0.000357 * 0.95 || hu2 > 0.13103 * 1.05) {
        return false;
    }
    if (hu3 < 0.00556 * 0.95 || hu3 > 0.070153 * 1.05) {
        return false;
    }
    if (hu4 < 0.000056 * 0.95 || hu4 > 0.011795 * 1.05) {
        return false;
    }
    if (hu5 < -0.000186 * 1.05 || hu5 > 0.000025 * 1.05) {
        return false;
    }
    if (hu6 < -0.002186 * 1.05 || hu6 > -0.000081 * 0.95) {
        return false;
    }
    if (hu7 < 0.029193 * 0.95 || hu7 > 0.063145 * 1.05) {
        return false;
    }

    return true;
}